

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::preprocess_op_codes(CompilerMSL *this)

{
  ParsedIR *this_00;
  bool *pbVar1;
  uint uVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  size_t sVar4;
  bool bVar5;
  byte bVar6;
  ExecutionModel EVar7;
  SPIRFunction *func;
  SPIRBlock *pSVar8;
  long lVar9;
  allocator local_d9;
  string local_d8;
  OpCodePreprocessor preproc;
  
  preproc.result_types._M_h._M_buckets = &preproc.result_types._M_h._M_single_bucket;
  preproc.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__OpCodePreprocessor_00354cd8;
  preproc.result_types._M_h._M_bucket_count = 1;
  preproc.result_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  preproc.result_types._M_h._M_element_count = 0;
  preproc.result_types._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  preproc.result_types._M_h._M_rehash_policy._M_next_resize = 0;
  preproc.result_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  preproc.image_pointers_emulated._M_h._M_buckets =
       &preproc.image_pointers_emulated._M_h._M_single_bucket;
  preproc.image_pointers_emulated._M_h._M_bucket_count = 1;
  preproc.image_pointers_emulated._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  preproc.image_pointers_emulated._M_h._M_element_count = 0;
  preproc.image_pointers_emulated._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  preproc.image_pointers_emulated._M_h._M_rehash_policy._M_next_resize = 0;
  preproc.image_pointers_emulated._M_h._M_single_bucket._0_2_ = 0;
  preproc.image_pointers_emulated._M_h._M_single_bucket._2_6_ = 0;
  preproc.suppress_missing_prototypes = false;
  preproc.uses_atomics = false;
  preproc.uses_image_write = false;
  preproc.uses_buffer_write = false;
  preproc.uses_discard = false;
  preproc.needs_local_invocation_index = false;
  preproc.needs_subgroup_invocation_id = false;
  preproc.needs_subgroup_size = false;
  preproc.needs_sample_id = false;
  preproc.needs_helper_invocation = false;
  preproc.compiler = this;
  func = Compiler::get<spirv_cross::SPIRFunction>
                   ((Compiler *)this,
                    (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  Compiler::traverse_all_reachable_opcodes((Compiler *)this,func,&preproc.super_OpcodeHandler);
  this->suppress_missing_prototypes = preproc.suppress_missing_prototypes;
  if (preproc.uses_atomics == true) {
    ::std::__cxx11::string::string((string *)&local_d8,"#include <metal_atomic>",&local_d9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::string
              ((string *)&local_d8,"#pragma clang diagnostic ignored \"-Wunused-variable\"",
               &local_d9);
    add_pragma_line(this,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
  }
  uVar2 = (this->msl_options).msl_version;
  if (((preproc.uses_buffer_write & uVar2 < 0x4e84) != 0) ||
     ((uVar2 < 0x4ee8 & preproc.uses_image_write) == 1)) {
    this->is_rasterization_disabled = true;
  }
  bVar5 = is_tesc_shader(this);
  if ((bVar5) ||
     ((EVar7 = Compiler::get_execution_model((Compiler *)this), EVar7 == ExecutionModelVertex &&
      ((this->msl_options).vertex_for_tessellation == true)))) {
    this->is_rasterization_disabled = true;
    this->capture_output_to_buffer = true;
  }
  if (preproc.needs_local_invocation_index == true) {
    this->needs_local_invocation_index = true;
  }
  if (preproc.needs_subgroup_invocation_id == true) {
    this->needs_subgroup_invocation_id = true;
  }
  if (preproc.needs_subgroup_size == true) {
    this->needs_subgroup_size = true;
  }
  if (((preproc.needs_sample_id != false) ||
      ((this->msl_options).force_sample_rate_shading != false)) ||
     ((bVar5 = is_sample_rate(this), bVar5 &&
      ((((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x8000) != 0 ||
       (((this->super_CompilerGLSL).super_Compiler.need_subpass_input_ms == true &&
        ((this->msl_options).use_framebuffer_fetch_subpasses == false)))))))) {
    this->needs_sample_id = true;
  }
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  if ((preproc.needs_helper_invocation != false) ||
     (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x800000) != 0)) {
    this->needs_helper_invocation = true;
  }
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[6].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[6].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar9 = 0; sVar4 << 2 != lVar9; lVar9 = lVar9 + 4) {
    uVar2 = *(uint *)((long)&pTVar3->id + lVar9);
    if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
         [uVar2].type == TypeBlock) &&
       (pSVar8 = ParsedIR::get<spirv_cross::SPIRBlock>(this_00,uVar2),
       *(int *)&(pSVar8->super_IVariant).field_0xc == 6)) {
      preproc.uses_discard = true;
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_d8);
  if ((preproc.uses_discard == true) &&
     ((preproc.uses_buffer_write != false || (preproc.uses_image_write == true)))) {
    bVar5 = (this->msl_options).check_discarded_frag_stores;
    this->frag_shader_needs_discard_checks = (bool)(this->frag_shader_needs_discard_checks | bVar5);
    bVar6 = 1;
    if (bVar5 == false) {
      bVar6 = (this->msl_options).force_fragment_with_side_effects_execution;
    }
    this->needs_helper_invocation = (bool)(this->needs_helper_invocation | bVar6);
    pbVar1 = &(this->msl_options).manual_helper_invocation_updates;
    *pbVar1 = (bool)(*pbVar1 | bVar6);
  }
  bVar5 = is_intersection_query(this);
  if (bVar5) {
    ::std::__cxx11::string::string((string *)&local_d8,"#if __METAL_VERSION__ >= 230",&local_d9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::string((string *)&local_d8,"#include <metal_raytracing>",&local_d9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::string
              ((string *)&local_d8,"using namespace metal::raytracing;",&local_d9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::string((string *)&local_d8,"#endif",&local_d9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
  }
  OpCodePreprocessor::~OpCodePreprocessor(&preproc);
  return;
}

Assistant:

void CompilerMSL::preprocess_op_codes()
{
	OpCodePreprocessor preproc(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), preproc);

	suppress_missing_prototypes = preproc.suppress_missing_prototypes;

	if (preproc.uses_atomics)
	{
		add_header_line("#include <metal_atomic>");
		add_pragma_line("#pragma clang diagnostic ignored \"-Wunused-variable\"");
	}

	// Before MSL 2.1 (2.2 for textures), Metal vertex functions that write to
	// resources must disable rasterization and return void.
	if ((preproc.uses_buffer_write && !msl_options.supports_msl_version(2, 1)) ||
	    (preproc.uses_image_write && !msl_options.supports_msl_version(2, 2)))
		is_rasterization_disabled = true;

	// Tessellation control shaders are run as compute functions in Metal, and so
	// must capture their output to a buffer.
	if (is_tesc_shader() || (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
	{
		is_rasterization_disabled = true;
		capture_output_to_buffer = true;
	}

	if (preproc.needs_local_invocation_index)
		needs_local_invocation_index = true;
	if (preproc.needs_subgroup_invocation_id)
		needs_subgroup_invocation_id = true;
	if (preproc.needs_subgroup_size)
		needs_subgroup_size = true;
	// build_implicit_builtins() hasn't run yet, and in fact, this needs to execute
	// before then so that gl_SampleID will get added; so we also need to check if
	// that function would add gl_FragCoord.
	if (preproc.needs_sample_id || msl_options.force_sample_rate_shading ||
	    (is_sample_rate() && (active_input_builtins.get(BuiltInFragCoord) ||
	                          (need_subpass_input_ms && !msl_options.use_framebuffer_fetch_subpasses))))
		needs_sample_id = true;
	if (preproc.needs_helper_invocation || active_input_builtins.get(BuiltInHelperInvocation))
		needs_helper_invocation = true;

	// OpKill is removed by the parser, so we need to identify those by inspecting
	// blocks.
	ir.for_each_typed_id<SPIRBlock>([&preproc](uint32_t, SPIRBlock &block) {
		if (block.terminator == SPIRBlock::Kill)
			preproc.uses_discard = true;
	});

	// Fragment shaders that both write to storage resources and discard fragments
	// need checks on the writes, to work around Metal allowing these writes despite
	// the fragment being dead. We also require to force Metal to execute fragment
	// shaders instead of being prematurely discarded.
	if (preproc.uses_discard && (preproc.uses_buffer_write || preproc.uses_image_write))
	{
		bool should_enable = (msl_options.check_discarded_frag_stores || msl_options.force_fragment_with_side_effects_execution);
		frag_shader_needs_discard_checks |= msl_options.check_discarded_frag_stores;
		needs_helper_invocation |= should_enable;
		// Fragment discard store checks imply manual HelperInvocation updates.
		msl_options.manual_helper_invocation_updates |= should_enable;
	}

	if (is_intersection_query())
	{
		add_header_line("#if __METAL_VERSION__ >= 230");
		add_header_line("#include <metal_raytracing>");
		add_header_line("using namespace metal::raytracing;");
		add_header_line("#endif");
	}
}